

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subprocess.cpp
# Opt level: O0

void __thiscall llbuild::basic::ProcessGroup::signalAll(ProcessGroup *this,int signal)

{
  bool bVar1;
  reference ppVar2;
  pair<const_int,_llbuild::basic::ProcessInfo> *it;
  iterator __end1;
  iterator __begin1;
  unordered_map<int,_llbuild::basic::ProcessInfo,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_llbuild::basic::ProcessInfo>_>_>
  *__range1;
  lock_guard<std::mutex> lock;
  int signal_local;
  ProcessGroup *this_local;
  
  lock._M_device._4_4_ = signal;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&__range1,&this->mutex);
  __end1 = std::
           unordered_map<int,_llbuild::basic::ProcessInfo,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_llbuild::basic::ProcessInfo>_>_>
           ::begin(&this->processes);
  it = (pair<const_int,_llbuild::basic::ProcessInfo> *)
       std::
       unordered_map<int,_llbuild::basic::ProcessInfo,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_llbuild::basic::ProcessInfo>_>_>
       ::end(&this->processes);
  while (bVar1 = std::__detail::operator!=
                           (&__end1.
                             super__Node_iterator_base<std::pair<const_int,_llbuild::basic::ProcessInfo>,_false>
                            ,(_Node_iterator_base<std::pair<const_int,_llbuild::basic::ProcessInfo>,_false>
                              *)&it), bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_int,_llbuild::basic::ProcessInfo>,_false,_false>::
             operator*(&__end1);
    if ((lock._M_device._4_4_ != 2) || (((ppVar2->second).canSafelyInterrupt & 1U) != 0)) {
      kill(-ppVar2->first,lock._M_device._4_4_);
    }
    std::__detail::_Node_iterator<std::pair<const_int,_llbuild::basic::ProcessInfo>,_false,_false>::
    operator++(&__end1);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&__range1);
  return;
}

Assistant:

void ProcessGroup::signalAll(int signal) {
  std::lock_guard<std::mutex> lock(mutex);

  for (const auto& it: processes) {
    // If we are interrupting, only interupt processes which are believed to
    // be safe to interrupt.
    if (signal == SIGINT && !it.second.canSafelyInterrupt)
      continue;

    // We are killing the whole process group here, this depends on us
    // spawning each process in its own group earlier.
#if defined(_WIN32)
    TerminateProcess(it.first, signal);
#else
    ::kill(-it.first, signal);
#endif
  }
}